

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_Fill_Test::TestBody(FormatterTest_Fill_Test *this)

{
  bool bVar1;
  char *in_RCX;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  longdouble lVar5;
  AssertionResult gtest_ar_15;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  undefined1 local_69;
  char *local_68;
  undefined8 local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid fill character \'{\'",
               (allocator *)&gtest_ar_15);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      gtest_ar_15.success_ = true;
      fmt::v5::format<char[8],char>(&local_38,(v5 *)"{0:{<5}",&gtest_ar_15.success_,in_RCX);
      std::__cxx11::string::~string((string *)&local_38);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: format(\"{0:{<5}\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pcVar2 = (char *)0x3a3;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3a3,pcVar4);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid fill character \'{\'",
               (allocator *)&gtest_ar_15);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      gtest_ar_15.success_ = true;
      fmt::v5::format<char[9],char>(&local_58,(v5 *)"{0:{<5}}",&gtest_ar_15.success_,pcVar2);
      std::__cxx11::string::~string((string *)&local_58);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [105])
               "Expected: format(\"{0:{<5}}\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x3a5;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3a5,pcVar4);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15.success_ = true;
  gtest_ar_15._1_3_ = 0;
  fmt::v5::format<char[8],int>(&gtest_expected_message,(v5 *)"{0:*>4}",&gtest_ar_15.success_,piVar3)
  ;
  piVar3 = (int *)0x1e7a34;
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"**42\"","format(\"{0:*>4}\", 42)",(char (*) [5])0x1e7a34,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar3 = (int *)0x3a6;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3a6,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15.success_ = true;
  gtest_ar_15._1_3_ = 0xffffff;
  fmt::v5::format<char[8],int>(&gtest_expected_message,(v5 *)"{0:*>5}",&gtest_ar_15.success_,piVar3)
  ;
  pcVar4 = "**-42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"**-42\"","format(\"{0:*>5}\", -42)",(char (*) [6])"**-42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3a7;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3a7,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15.success_ = true;
  gtest_ar_15._1_3_ = 0;
  fmt::v5::format<char[8],unsigned_int>
            (&gtest_expected_message,(v5 *)"{0:*>5}",&gtest_ar_15.success_,(uint *)pcVar4);
  pcVar4 = "***42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"***42\"","format(\"{0:*>5}\", 42u)",(char (*) [6])"***42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3a8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3a8,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15.success_ = true;
  gtest_ar_15._1_3_ = 0xffffff;
  gtest_ar_15._4_4_ = 0xffffffff;
  fmt::v5::format<char[8],long>
            (&gtest_expected_message,(v5 *)"{0:*>5}",&gtest_ar_15.success_,(long *)pcVar4);
  pcVar4 = "**-42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"**-42\"","format(\"{0:*>5}\", -42l)",(char (*) [6])"**-42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3a9;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3a9,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15.success_ = true;
  gtest_ar_15._1_3_ = 0;
  gtest_ar_15._4_4_ = 0;
  fmt::v5::format<char[8],unsigned_long>
            (&gtest_expected_message,(v5 *)"{0:*>5}",&gtest_ar_15.success_,(unsigned_long *)pcVar4);
  pcVar4 = "***42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"***42\"","format(\"{0:*>5}\", 42ul)",(char (*) [6])"***42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3aa;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3aa,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15.success_ = true;
  gtest_ar_15._1_3_ = 0xffffff;
  gtest_ar_15._4_4_ = 0xffffffff;
  fmt::v5::format<char[8],long_long>
            (&gtest_expected_message,(v5 *)"{0:*>5}",&gtest_ar_15.success_,(longlong *)pcVar4);
  pcVar4 = "**-42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"**-42\"","format(\"{0:*>5}\", -42ll)",(char (*) [6])"**-42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3ab;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3ab,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15.success_ = true;
  gtest_ar_15._1_3_ = 0;
  gtest_ar_15._4_4_ = 0;
  fmt::v5::format<char[8],unsigned_long_long>
            (&gtest_expected_message,(v5 *)"{0:*>5}",&gtest_ar_15.success_,
             (unsigned_long_long *)pcVar4);
  pcVar4 = "***42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"***42\"","format(\"{0:*>5}\", 42ull)",(char (*) [6])"***42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3ac;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3ac,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15.success_ = false;
  gtest_ar_15._1_3_ = 0;
  gtest_ar_15._4_4_ = 0xc0450000;
  fmt::v5::format<char[8],double>
            (&gtest_expected_message,(v5 *)"{0:*>5}",&gtest_ar_15.success_,(double *)pcVar4);
  pcVar4 = "**-42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"**-42\"","format(\"{0:*>5}\", -42.0)",(char (*) [6])"**-42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3ad;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3ad,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  lVar5 = (longdouble)-42.0;
  gtest_ar_15._0_4_ = SUB104(lVar5,0);
  gtest_ar_15._4_4_ = SUB104((unkuint10)lVar5 >> 0x20,0);
  gtest_ar_15.message_.ptr_._0_2_ = (undefined2)((unkuint10)lVar5 >> 0x40);
  fmt::v5::format<char[8],long_double>
            (&gtest_expected_message,(v5 *)"{0:*>5}",&gtest_ar_15.success_,(longdouble *)pcVar4);
  pcVar4 = "**-42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"**-42\"","format(\"{0:*>5}\", -42.0l)",(char (*) [6])"**-42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3ae;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3ae,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15.success_ = true;
  fmt::v5::format<char[8],char>
            (&gtest_expected_message,(v5 *)"{0:*<5}",&gtest_ar_15.success_,pcVar4);
  pcVar4 = "c****";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"c****\"","format(\"{0:*<5}\", \'c\')",(char (*) [6])"c****",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3af;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3af,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::format<char[8],char[4]>
            (&gtest_expected_message,(v5 *)"{0:*<5}",(char (*) [8])0x1e6e09,(char (*) [4])pcVar4);
  pcVar4 = "abc**";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"abc**\"","format(\"{0:*<5}\", \"abc\")",(char (*) [6])"abc**",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3b0;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b0,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15.success_ = true;
  gtest_ar_15._1_3_ = 0xfa;
  gtest_ar_15._4_4_ = 0;
  fmt::v5::format<char[8],void*>
            (&gtest_expected_message,(v5 *)"{0:*>8}",&gtest_ar_15.success_,(void **)pcVar4);
  pcVar4 = "**0xface";
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"**0xface\"",
             "format(\"{0:*>8}\", reinterpret_cast<void*>(0xface))",(char (*) [9])"**0xface",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3b1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b1,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::format<char[5],char[4]>
            (&gtest_expected_message,(v5 *)"{:}=",(char (*) [5])0x1f1f17,(char (*) [4])pcVar4);
  pcVar4 = "foo=";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"foo=\"","format(\"{:}=\", \"foo\")",(char (*) [5])"foo=",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar4 = (char *)0x3b2;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b2,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_expected_message._M_dataplus._M_p = (pointer)&gtest_expected_message.field_2;
  gtest_expected_message.field_2._M_allocated_capacity._0_4_ = 0x2a000000;
  gtest_expected_message._M_string_length = 4;
  gtest_expected_message.field_2._M_local_buf[4] = '\0';
  local_68 = "{:";
  local_60 = 6;
  local_69 = 0x2a;
  fmt::v5::format<fmt::v5::basic_string_view<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)&local_68,(basic_string_view<char> *)&local_69,pcVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_15,"std::string(\"\\0\\0\\0*\", 4)",
             "format(string_view(\"{:\\0>4}\", 6), \'*\')",&gtest_expected_message,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar_15.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if ((undefined8 *)CONCAT62(gtest_ar_15.message_.ptr_._2_6_,gtest_ar_15.message_.ptr_._0_2_) ==
        (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT62(gtest_ar_15.message_.ptr_._2_6_,gtest_ar_15.message_.ptr_._0_2_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b3,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_15.message_);
  return;
}

Assistant:

TEST(FormatterTest, Fill) {
  EXPECT_THROW_MSG(format("{0:{<5}", 'c'),
      format_error, "invalid fill character '{'");
  EXPECT_THROW_MSG(format("{0:{<5}}", 'c'),
      format_error, "invalid fill character '{'");
  EXPECT_EQ("**42", format("{0:*>4}", 42));
  EXPECT_EQ("**-42", format("{0:*>5}", -42));
  EXPECT_EQ("***42", format("{0:*>5}", 42u));
  EXPECT_EQ("**-42", format("{0:*>5}", -42l));
  EXPECT_EQ("***42", format("{0:*>5}", 42ul));
  EXPECT_EQ("**-42", format("{0:*>5}", -42ll));
  EXPECT_EQ("***42", format("{0:*>5}", 42ull));
  EXPECT_EQ("**-42", format("{0:*>5}", -42.0));
  EXPECT_EQ("**-42", format("{0:*>5}", -42.0l));
  EXPECT_EQ("c****", format("{0:*<5}", 'c'));
  EXPECT_EQ("abc**", format("{0:*<5}", "abc"));
  EXPECT_EQ("**0xface", format("{0:*>8}", reinterpret_cast<void*>(0xface)));
  EXPECT_EQ("foo=", format("{:}=", "foo"));
  EXPECT_EQ(std::string("\0\0\0*", 4), format(string_view("{:\0>4}", 6), '*'));
}